

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMRangeImpl::DOMRangeImpl(DOMRangeImpl *this,DOMDocument *doc,MemoryManager *manager)

{
  DOMNode *pDVar1;
  
  (this->super_DOMRange)._vptr_DOMRange = (_func_int **)&PTR__DOMRangeImpl_00405bf0;
  pDVar1 = &doc->super_DOMNode;
  if (doc == (DOMDocument *)0x0) {
    pDVar1 = (DOMNode *)0x0;
  }
  this->fStartContainer = pDVar1;
  this->fStartOffset = 0;
  this->fEndContainer = pDVar1;
  this->fEndOffset = 0;
  this->fCollapsed = true;
  this->fDocument = doc;
  this->fDetached = false;
  this->fRemoveChild = (DOMNode *)0x0;
  this->fMemoryManager = manager;
  return;
}

Assistant:

DOMRangeImpl::DOMRangeImpl(DOMDocument* doc, MemoryManager* const manager)

    :   fStartContainer(doc),     
        fStartOffset(0),
        fEndContainer(doc),
        fEndOffset(0),        
        fCollapsed(true),
        fDocument(doc),   
        fDetached(false),
        fRemoveChild(0),
        fMemoryManager(manager)
{
}